

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *this,DenseIndex rows,
          DenseIndex cols,DenseIndex depth)

{
  long lVar1;
  
  (this->super_level3_blocking<double,_double>).m_blockW = (RhsScalar *)0x0;
  (this->super_level3_blocking<double,_double>).m_blockA = (LhsScalar *)0x0;
  (this->super_level3_blocking<double,_double>).m_blockB = (RhsScalar *)0x0;
  (this->super_level3_blocking<double,_double>).m_mc = rows;
  (this->super_level3_blocking<double,_double>).m_nc = cols;
  (this->super_level3_blocking<double,_double>).m_kc = depth;
  computeProductBlockingSizes<double,double,4,long>
            (&(this->super_level3_blocking<double,_double>).m_kc,
             &(this->super_level3_blocking<double,_double>).m_mc,
             &(this->super_level3_blocking<double,_double>).m_nc);
  lVar1 = (this->super_level3_blocking<double,_double>).m_kc;
  this->m_sizeA = (this->super_level3_blocking<double,_double>).m_mc * lVar1;
  this->m_sizeB = (this->super_level3_blocking<double,_double>).m_nc * lVar1;
  this->m_sizeW = lVar1 << 3;
  return;
}

Assistant:

gemm_blocking_space(DenseIndex rows, DenseIndex cols, DenseIndex depth)
    {
      this->m_mc = Transpose ? cols : rows;
      this->m_nc = Transpose ? rows : cols;
      this->m_kc = depth;

      computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, this->m_nc);
      m_sizeA = this->m_mc * this->m_kc;
      m_sizeB = this->m_kc * this->m_nc;
      m_sizeW = this->m_kc*Traits::WorkSpaceFactor;
    }